

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::IfcRationalBezierCurve
          (IfcRationalBezierCurve *this)

{
  *(undefined ***)&this->field_0xe8 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0xf0 = 0;
  *(char **)&this->field_0xf8 = "IfcRationalBezierCurve";
  IfcBezierCurve::IfcBezierCurve((IfcBezierCurve *)this,&PTR_construction_vtable_24__008bcfd8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8bcea8;
  *(undefined8 *)&this->field_0xe8 = 0x8bcfc0;
  *(undefined8 *)&this->field_0x10 = 0x8bced0;
  *(undefined8 *)&this->field_0x20 = 0x8bcef8;
  *(undefined8 *)&this->field_0x30 = 0x8bcf20;
  *(undefined8 *)&this->field_0x40 = 0x8bcf48;
  *(undefined8 *)&this->field_0xb0 = 0x8bcf70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x8bcf98;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}